

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ast.cc
# Opt level: O0

bool __thiscall
pegmatite::ASTContainer::construct(ASTContainer *this,InputRange *r,ASTStack *st,ErrorReporter *err)

{
  ASTMember *pAVar1;
  bool bVar2;
  byte bVar3;
  reference ppAVar4;
  ASTMember *member;
  undefined1 local_38 [8];
  reverse_iterator it;
  bool success;
  ErrorReporter *err_local;
  ASTStack *st_local;
  InputRange *r_local;
  ASTContainer *this_local;
  
  it.current._M_current._7_1_ = 1;
  std::vector<pegmatite::ASTMember_*,_std::allocator<pegmatite::ASTMember_*>_>::rbegin
            ((vector<pegmatite::ASTMember_*,_std::allocator<pegmatite::ASTMember_*>_> *)local_38);
  while( true ) {
    std::vector<pegmatite::ASTMember_*,_std::allocator<pegmatite::ASTMember_*>_>::rend
              ((vector<pegmatite::ASTMember_*,_std::allocator<pegmatite::ASTMember_*>_> *)&member);
    bVar2 = std::operator!=((reverse_iterator<__gnu_cxx::__normal_iterator<pegmatite::ASTMember_**,_std::vector<pegmatite::ASTMember_*,_std::allocator<pegmatite::ASTMember_*>_>_>_>
                             *)local_38,
                            (reverse_iterator<__gnu_cxx::__normal_iterator<pegmatite::ASTMember_**,_std::vector<pegmatite::ASTMember_*,_std::allocator<pegmatite::ASTMember_*>_>_>_>
                             *)&member);
    if (!bVar2) break;
    ppAVar4 = std::
              reverse_iterator<__gnu_cxx::__normal_iterator<pegmatite::ASTMember_**,_std::vector<pegmatite::ASTMember_*,_std::allocator<pegmatite::ASTMember_*>_>_>_>
              ::operator*((reverse_iterator<__gnu_cxx::__normal_iterator<pegmatite::ASTMember_**,_std::vector<pegmatite::ASTMember_*,_std::allocator<pegmatite::ASTMember_*>_>_>_>
                           *)local_38);
    pAVar1 = *ppAVar4;
    bVar3 = (*(code *)**(undefined8 **)
                        ((long)&pAVar1->field_0x0 + *(long *)(*(long *)pAVar1 + -0x28)))
                      ((long)&pAVar1->field_0x0 + *(long *)(*(long *)pAVar1 + -0x28),r,st,err);
    it.current._M_current._7_1_ = (it.current._M_current._7_1_ & 1) != 0 || (bVar3 & 1) != 0;
    std::
    reverse_iterator<__gnu_cxx::__normal_iterator<pegmatite::ASTMember_**,_std::vector<pegmatite::ASTMember_*,_std::allocator<pegmatite::ASTMember_*>_>_>_>
    ::operator++((reverse_iterator<__gnu_cxx::__normal_iterator<pegmatite::ASTMember_**,_std::vector<pegmatite::ASTMember_*,_std::allocator<pegmatite::ASTMember_*>_>_>_>
                  *)local_38);
  }
  std::vector<pegmatite::ASTMember_*,_std::allocator<pegmatite::ASTMember_*>_>::clear
            (&this->members);
  return (bool)(it.current._M_current._7_1_ & 1);
}

Assistant:

bool ASTContainer::construct(const InputRange &r, ASTStack &st,
                             const ErrorReporter &err)
{
	bool success = true;

	for(auto it = members.rbegin(); it != members.rend(); ++it)
	{
		ASTMember *member = *it;
		success |= member->construct(r, st, err);
	}
	// We don't need the members vector anymore, so clean up the storage it
	// uses.
	members.clear();
	return success;
}